

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O2

nh_bool find_gend(nh_roles_info *ri,char *gend_str,int *out_gend)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)ri->num_genders;
  if (ri->num_genders < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      return '\0';
    }
    iVar1 = strcmp(gend_str,ri->gendnames[uVar2]);
    if (iVar1 == 0) break;
    uVar2 = uVar2 + 1;
  }
  *out_gend = (int)uVar2;
  return '\x01';
}

Assistant:

static nh_bool find_gend(const struct nh_roles_info *ri,
			 const char *gend_str, int *out_gend)
{
    int i;

    for (i = 0; i < ri->num_genders; i++) {
	if (!strcmp(gend_str, ri->gendnames[i])) {
	    *out_gend = i;
	    return TRUE;
	}
    }
    return FALSE;
}